

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flex.cpp
# Opt level: O2

Element ftxui::yflex_grow(Element *child)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Element EVar2;
  element_type *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::
  make_shared<ftxui::(anonymous_namespace)::Flex,void(&)(ftxui::Requirement&),std::shared_ptr<ftxui::Node>>
            ((_func_void_Requirement_ptr *)&local_18,
             (shared_ptr<ftxui::Node> *)anon_unknown_2::function_yflex_grow);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_18;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       _Var1._M_pi;
  local_18 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)child;
  return (Element)EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element yflex_grow(Element child) {
  return std::make_shared<Flex>(function_yflex_grow, std::move(child));
}